

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conn.cpp
# Opt level: O3

int __thiscall Conn::init(Conn *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int in_EDX;
  
  this->_listen_fd = (int)ctx;
  this->_cur_conn_size = 0;
  this->_max_conn_size = in_EDX;
  iVar1 = Epoll::create_epool(&this->_epoll,in_EDX);
  this->_cur_handler = 0;
  return CONCAT31((int3)((uint)iVar1 >> 8),1);
}

Assistant:

bool Conn::init(const int listen_fd, const int max_conn_size)
{
    _listen_fd = listen_fd;
    _cur_conn_size = 0;
    _max_conn_size = max_conn_size;

    _epoll.create_epool(_max_conn_size);

    _cur_handler = 0;

    return true;
}